

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void mir::inst::display_op(ostream *o,OpAcc val)

{
  if (val == MulShAdd) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"MulShAdd",8);
    return;
  }
  if (val == MulAdd) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"MulAdd",6);
    return;
  }
  return;
}

Assistant:

void display_op(std::ostream& o, OpAcc val) {
  switch (val) {
    case OpAcc::MulAdd:
      o << "MulAdd";
      break;
    case OpAcc::MulShAdd:
      o << "MulShAdd";
      break;
  }
}